

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O3

CURLcode Curl_req_send_more(Curl_easy *data)

{
  bufq *q;
  _Bool _Var1;
  CURLcode CVar2;
  CURLcode CVar3;
  ssize_t sVar4;
  CURLcode local_1c;
  
  if (((*(ushort *)&(data->req).field_0xd1 & 0x220) == 0) && (((data->req).keepon & 0x20) == 0)) {
    q = &(data->req).sendbuf;
    _Var1 = Curl_bufq_is_full(q);
    if ((!_Var1) &&
       (sVar4 = Curl_bufq_sipn(q,0,add_from_client,data,&local_1c),
       local_1c != CURLE_AGAIN && sVar4 < 0)) {
      return local_1c;
    }
  }
  CVar2 = req_flush(data);
  CVar3 = CURLE_OK;
  if (CVar2 != CURLE_AGAIN) {
    CVar3 = CVar2;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_req_send_more(struct Curl_easy *data)
{
  CURLcode result;

  /* Fill our send buffer if more from client can be read. */
  if(!data->req.upload_aborted &&
     !data->req.eos_read &&
     !(data->req.keepon & KEEP_SEND_PAUSE) &&
     !Curl_bufq_is_full(&data->req.sendbuf)) {
    ssize_t nread = Curl_bufq_sipn(&data->req.sendbuf, 0,
                                   add_from_client, data, &result);
    if(nread < 0 && result != CURLE_AGAIN)
      return result;
  }

  result = req_flush(data);
  if(result == CURLE_AGAIN)
    result = CURLE_OK;

  return result;
}